

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynet.cc
# Opt level: O0

VariableIndex __thiscall
dynet::ComputationGraph::add_input
          (ComputationGraph *this,Dim *d,vector<float,_std::allocator<float>_> *pm,Device *device)

{
  size_type sVar1;
  Dim *d_00;
  reference ppNVar2;
  Device *in_RCX;
  vector<dynet::Node_*,_std::allocator<dynet::Node_*>_> *in_RDI;
  VariableIndex new_node_index;
  value_type *in_stack_ffffffffffffff98;
  vector<dynet::Node_*,_std::allocator<dynet::Node_*>_> *in_stack_ffffffffffffffa0;
  InputNode *in_stack_ffffffffffffffc0;
  
  sVar1 = std::vector<dynet::Node_*,_std::allocator<dynet::Node_*>_>::size(in_RDI);
  d_00 = (Dim *)operator_new(0xa8);
  InputNode::InputNode
            (in_stack_ffffffffffffffc0,d_00,(vector<float,_std::allocator<float>_> *)in_RDI);
  std::vector<dynet::Node_*,_std::allocator<dynet::Node_*>_>::push_back
            (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  ppNVar2 = std::vector<dynet::Node_*,_std::allocator<dynet::Node_*>_>::back
                      ((vector<dynet::Node_*,_std::allocator<dynet::Node_*>_> *)in_RCX);
  (*ppNVar2)->device = in_RCX;
  set_dim_for_new_node((ComputationGraph *)pm,(VariableIndex *)device);
  return (VariableIndex)sVar1;
}

Assistant:

VariableIndex ComputationGraph::add_input(const Dim& d, const vector<float>& pm, Device *device) {
  VariableIndex new_node_index(nodes.size());
  nodes.push_back(new InputNode(d, pm));
  nodes.back()->device = device;
  set_dim_for_new_node(new_node_index);
  return new_node_index;
}